

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalUpdate::Sink
          (PhysicalUpdate *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  DataChunk *input_00;
  vector<duckdb::PhysicalIndex,_true> *column_ids_00;
  DataChunk *this_00;
  data_ptr_t pdVar1;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_01;
  __pthread_list_t *p_Var2;
  GlobalSinkState *pGVar3;
  UpdateLocalState *this_02;
  data_ptr_t pdVar4;
  const_reference pvVar5;
  pointer pEVar6;
  const_reference pvVar7;
  reference pvVar8;
  BoundReferenceExpression *pBVar9;
  reference pvVar10;
  iterator iVar11;
  reference other;
  DuckTransaction *transaction;
  __buckets_ptr pp_Var12;
  TableUpdateState *state;
  TableDeleteState *state_00;
  idx_t i;
  ulong uVar13;
  DataChunk *this_03;
  idx_t i_1;
  __buckets_ptr pp_Var14;
  idx_t iVar15;
  SelectionVector sel;
  vector<duckdb::StorageIndex,_true> column_ids;
  Vector del_row_ids;
  ColumnFetchState local_80;
  
  pGVar3 = input->global_state;
  this_02 = (UpdateLocalState *)input->local_state;
  DataChunk::Flatten(chunk);
  (this_02->default_executor).chunk = chunk;
  this_00 = &this_02->update_chunk;
  DataChunk::Reset(this_00);
  (this_02->update_chunk).count = chunk->count;
  column_ids_00 = &this->columns;
  for (uVar13 = 0;
      uVar13 < (ulong)((long)(this->expressions).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->expressions).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar13 = uVar13 + 1) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(&this->expressions,uVar13);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    if ((pEVar6->super_BaseExpression).type == VALUE_DEFAULT) {
      pvVar7 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids_00,uVar13);
      iVar15 = pvVar7->index;
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar13);
      ExpressionExecutor::ExecuteExpression(&this_02->default_executor,iVar15,pvVar8);
    }
    else {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&this->expressions,uVar13);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pBVar9 = BaseExpression::Cast<duckdb::BoundReferenceExpression>(&pEVar6->super_BaseExpression)
      ;
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar13);
      pvVar10 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,pBVar9->index);
      Vector::Reference(pvVar8,pvVar10);
    }
  }
  ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(pGVar3 + 1))->__data);
  pvVar8 = vector<duckdb::Vector,_true>::get<true>
                     (&chunk->data,
                      ((long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(chunk->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68 - 1);
  input_00 = &this_02->mock_chunk;
  if (this->update_is_del_and_insert == false) {
    if (this->return_chunk == true) {
      (this_02->mock_chunk).count = (this_02->update_chunk).count;
      for (uVar13 = 0;
          uVar13 < (ulong)((long)(this->columns).
                                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 .
                                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->columns).
                                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 .
                                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar13 = uVar13 + 1) {
        pvVar7 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids_00,uVar13);
        pvVar10 = vector<duckdb::Vector,_true>::get<true>(&input_00->data,pvVar7->index);
        other = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar13);
        Vector::Reference(pvVar10,other);
      }
    }
    state = UpdateLocalState::GetUpdateState(this_02,this->table,this->tableref,context->client);
    DataTable::Update(this->table,state,context->client,pvVar8,column_ids_00,this_00);
    if (this->return_chunk == true) {
      ColumnDataCollection::Append
                ((ColumnDataCollection *)&pGVar3[2].super_StateWithBlockableTasks.lock,input_00);
    }
    p_Var2 = &pGVar3[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
    ;
    p_Var2->__prev = (__pthread_internal_list *)((long)&p_Var2->__prev->__prev + chunk->count);
  }
  else {
    SelectionVector::SelectionVector(&sel,(this_02->update_chunk).count);
    pdVar4 = pvVar8->data;
    this_01 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)&pGVar3[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                  __list.__next;
    iVar15 = 0;
    for (uVar13 = 0; uVar13 < (this_02->update_chunk).count; uVar13 = uVar13 + 1) {
      pdVar1 = pdVar4 + uVar13 * 8;
      del_row_ids.vector_type = pdVar1[0];
      del_row_ids._1_1_ = pdVar1[1];
      del_row_ids._2_1_ = pdVar1[2];
      del_row_ids._3_1_ = pdVar1[3];
      del_row_ids._4_1_ = pdVar1[4];
      del_row_ids._5_1_ = pdVar1[5];
      del_row_ids._6_1_ = pdVar1[6];
      del_row_ids._7_1_ = pdVar1[7];
      iVar11 = ::std::
               _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(this_01,(key_type_conflict *)&del_row_ids);
      if (iVar11.super__Node_iterator_base<long,_false>._M_cur == (__node_type *)0x0) {
        ::std::__detail::
        _Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)this_01,(value_type *)&del_row_ids);
        sel.sel_vector[iVar15] = (sel_t)uVar13;
        iVar15 = iVar15 + 1;
      }
    }
    Vector::Vector(&del_row_ids,pvVar8);
    if (iVar15 != (this_02->update_chunk).count) {
      DataChunk::Slice(this_00,&sel,iVar15);
      Vector::Slice(&del_row_ids,pvVar8,&sel,iVar15);
    }
    this_03 = &this_02->delete_chunk;
    if (this->index_update == false) {
      this_03 = input_00;
    }
    DataChunk::Reset(this_03);
    this_03->count = iVar15;
    if (this->index_update == true) {
      transaction = DuckTransaction::Get(context->client,this->table->db);
      column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pp_Var14 = (__buckets_ptr)0x0;
      while( true ) {
        local_80.handles._M_h._M_buckets = pp_Var14;
        pp_Var12 = (__buckets_ptr)DataTable::ColumnCount(this->table);
        if (pp_Var12 <= pp_Var14) break;
        ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
        emplace_back<unsigned_long&>
                  ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&column_ids,
                   (unsigned_long *)&local_80);
        pp_Var14 = (__buckets_ptr)((long)local_80.handles._M_h._M_buckets + 1);
      }
      local_80.handles._M_h._M_buckets = &local_80.handles._M_h._M_single_bucket;
      local_80.handles._M_h._M_bucket_count = 1;
      local_80.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_80.handles._M_h._M_element_count = 0;
      local_80.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_80.handles._M_h._M_rehash_policy._4_4_ = 0;
      local_80.handles._M_h._M_rehash_policy._M_next_resize = 0;
      local_80.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_80.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      DataTable::Fetch(this->table,transaction,this_03,&column_ids,pvVar8,iVar15,&local_80);
      ColumnFetchState::~ColumnFetchState(&local_80);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                (&column_ids.
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
    }
    state_00 = UpdateLocalState::GetDeleteState(this_02,this->table,this->tableref,context->client);
    DataTable::Delete(this->table,state_00,context->client,&del_row_ids,iVar15);
    (this_02->mock_chunk).count = iVar15;
    for (uVar13 = 0;
        uVar13 < (ulong)((long)(this->columns).
                               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                               .
                               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->columns).
                               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                               .
                               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar13 = uVar13 + 1)
    {
      pvVar7 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids_00,uVar13);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&input_00->data,pvVar7->index);
      pvVar10 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar13);
      Vector::Reference(pvVar8,pvVar10);
    }
    DataTable::LocalAppend
              (this->table,this->tableref,context->client,input_00,&this->bound_constraints,
               &del_row_ids,this_03);
    if (this->return_chunk == true) {
      ColumnDataCollection::Append
                ((ColumnDataCollection *)&pGVar3[2].super_StateWithBlockableTasks.lock,input_00);
    }
    p_Var2 = &pGVar3[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
    ;
    p_Var2->__prev = (__pthread_internal_list *)((long)&p_Var2->__prev->__prev + chunk->count);
    Vector::~Vector(&del_row_ids);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar3 + 1));
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalUpdate::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &g_state = input.global_state.Cast<UpdateGlobalState>();
	auto &l_state = input.local_state.Cast<UpdateLocalState>();

	chunk.Flatten();
	l_state.default_executor.SetChunk(chunk);

	DataChunk &update_chunk = l_state.update_chunk;
	update_chunk.Reset();
	update_chunk.SetCardinality(chunk);

	for (idx_t i = 0; i < expressions.size(); i++) {
		// Default expression, set to the default value of the column.
		if (expressions[i]->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
			l_state.default_executor.ExecuteExpression(columns[i].index, update_chunk.data[i]);
			continue;
		}

		D_ASSERT(expressions[i]->GetExpressionType() == ExpressionType::BOUND_REF);
		auto &binding = expressions[i]->Cast<BoundReferenceExpression>();
		update_chunk.data[i].Reference(chunk.data[binding.index]);
	}

	lock_guard<mutex> glock(g_state.lock);
	auto &row_ids = chunk.data[chunk.ColumnCount() - 1];
	DataChunk &mock_chunk = l_state.mock_chunk;

	// Regular in-place update.
	if (!update_is_del_and_insert) {
		if (return_chunk) {
			mock_chunk.SetCardinality(update_chunk);
			for (idx_t i = 0; i < columns.size(); i++) {
				mock_chunk.data[columns[i].index].Reference(update_chunk.data[i]);
			}
		}
		auto &update_state = l_state.GetUpdateState(table, tableref, context.client);
		table.Update(update_state, context.client, row_ids, columns, update_chunk);

		if (return_chunk) {
			g_state.return_collection.Append(mock_chunk);
		}
		g_state.updated_count += chunk.size();
		return SinkResultType::NEED_MORE_INPUT;
	}

	// We update an index or a complex type, so we need to split the UPDATE into DELETE + INSERT.

	// Keep track of the rows that have not yet been deleted in this UPDATE.
	// This is required since we might see the same row_id multiple times, e.g.,
	// during an UPDATE containing joins.
	SelectionVector sel(update_chunk.size());
	idx_t update_count = 0;
	auto row_id_data = FlatVector::GetData<row_t>(row_ids);

	for (idx_t i = 0; i < update_chunk.size(); i++) {
		auto row_id = row_id_data[i];
		if (g_state.updated_rows.find(row_id) == g_state.updated_rows.end()) {
			g_state.updated_rows.insert(row_id);
			sel.set_index(update_count++, i);
		}
	}

	// The update chunk now contains exactly those rows that we are deleting.
	Vector del_row_ids(row_ids);
	if (update_count != update_chunk.size()) {
		update_chunk.Slice(sel, update_count);
		del_row_ids.Slice(row_ids, sel, update_count);
	}

	auto &delete_chunk = index_update ? l_state.delete_chunk : l_state.mock_chunk;
	delete_chunk.Reset();
	delete_chunk.SetCardinality(update_count);

	if (index_update) {
		auto &transaction = DuckTransaction::Get(context.client, table.db);
		vector<StorageIndex> column_ids;
		for (idx_t i = 0; i < table.ColumnCount(); i++) {
			column_ids.emplace_back(i);
		};
		// We need to fetch the previous index keys to add them to the delete index.
		auto fetch_state = ColumnFetchState();
		table.Fetch(transaction, delete_chunk, column_ids, row_ids, update_count, fetch_state);
	}

	auto &delete_state = l_state.GetDeleteState(table, tableref, context.client);
	table.Delete(delete_state, context.client, del_row_ids, update_count);

	// Arrange the columns in the standard table order.
	mock_chunk.SetCardinality(update_count);
	for (idx_t i = 0; i < columns.size(); i++) {
		mock_chunk.data[columns[i].index].Reference(update_chunk.data[i]);
	}

	table.LocalAppend(tableref, context.client, mock_chunk, bound_constraints, del_row_ids, delete_chunk);
	if (return_chunk) {
		g_state.return_collection.Append(mock_chunk);
	}

	g_state.updated_count += chunk.size();
	return SinkResultType::NEED_MORE_INPUT;
}